

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_4b12d7::LosslessTestLarge::PreEncodeFrameHook
          (LosslessTestLarge *this,VideoSource *video,Encoder *encoder)

{
  int iVar1;
  long *in_RSI;
  long in_RDI;
  int in_stack_00000048;
  int in_stack_0000004c;
  Encoder *in_stack_00000050;
  
  iVar1 = (**(code **)(*in_RSI + 0x40))();
  if (iVar1 == 0) {
    if ((*(int *)(in_RDI + 0xc0) != 0) || (*(int *)(in_RDI + 0xbc) != 0)) {
      libaom_test::Encoder::Control(in_stack_00000050,in_stack_0000004c,in_stack_00000048);
    }
    libaom_test::Encoder::Control(in_stack_00000050,in_stack_0000004c,in_stack_00000048);
  }
  return;
}

Assistant:

void PreEncodeFrameHook(::libaom_test::VideoSource *video,
                          ::libaom_test::Encoder *encoder) override {
    if (video->frame() == 0) {
      // Only call Control if quantizer > 0 to verify that using quantizer
      // alone will activate lossless
      if (cfg_.rc_max_quantizer > 0 || cfg_.rc_min_quantizer > 0) {
        encoder->Control(AV1E_SET_LOSSLESS, 1);
      }
      encoder->Control(AOME_SET_CPUUSED, cpu_used_);
    }
  }